

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagholder.cpp
# Opt level: O0

Value * __thiscall camp::TagHolder::tagId(TagHolder *this,size_t index)

{
  size_t index_00;
  size_type sVar1;
  OutOfRange *__return_storage_ptr__;
  pointer ppVar2;
  _Rb_tree_const_iterator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>
  local_c8;
  const_iterator it;
  string local_b8 [39];
  allocator local_91;
  string local_90 [48];
  OutOfRange local_60;
  size_t local_18;
  size_t index_local;
  TagHolder *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  sVar1 = std::
          map<camp::Value,_camp::detail::Getter<camp::Value>,_std::less<camp::Value>,_std::allocator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>_>
          ::size(&this->m_tags);
  if (sVar1 <= index) {
    it._M_node._6_1_ = 1;
    __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
    index_00 = local_18;
    sVar1 = std::
            map<camp::Value,_camp::detail::Getter<camp::Value>,_std::less<camp::Value>,_std::allocator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>_>
            ::size(&this->m_tags);
    OutOfRange::OutOfRange(&local_60,index_00,sVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/tagholder.cpp"
               ,&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"const Value &camp::TagHolder::tagId(std::size_t) const",
               (allocator *)((long)&it._M_node + 7));
    Error::prepare<camp::OutOfRange>
              (__return_storage_ptr__,&local_60,(string *)local_90,0x37,(string *)local_b8);
    it._M_node._6_1_ = 0;
    __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,OutOfRange::~OutOfRange);
  }
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<camp::Value,_camp::detail::Getter<camp::Value>,_std::less<camp::Value>,_std::allocator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>_>
       ::begin(&this->m_tags);
  std::
  advance<std::_Rb_tree_const_iterator<std::pair<camp::Value_const,camp::detail::Getter<camp::Value>>>,unsigned_long>
            (&local_c8,local_18);
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>
           ::operator->(&local_c8);
  return &ppVar2->first;
}

Assistant:

const Value& TagHolder::tagId(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_tags.size())
        CAMP_ERROR(OutOfRange(index, m_tags.size()));

    TagsTable::const_iterator it = m_tags.begin();
    std::advance(it, index);

    return it->first;
}